

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  Finder *pFVar1;
  long lVar2;
  OneofDescriptor *oneof_descriptor;
  size_t sVar3;
  size_type __n;
  bool bVar4;
  bool bVar5;
  int iVar6;
  CppType CVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExtensionRange *pEVar8;
  undefined4 extraout_var_02;
  FieldDescriptor *pFVar9;
  Descriptor *pDVar10;
  long *plVar11;
  undefined4 extraout_var_03;
  undefined8 *puVar12;
  Descriptor *pDVar13;
  ReservedRange *pRVar14;
  LogMessage *other;
  FieldDescriptor *pFVar15;
  MessageFactory *factory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  MessageLite *this_00;
  AlphaNum *in_RCX;
  size_type *psVar17;
  Reflection *extraout_RDX;
  char *pcVar18;
  code *pcVar19;
  FieldDescriptor *pFVar20;
  code *pcVar21;
  ulong uVar22;
  Tokenizer *this_01;
  ulong uVar23;
  ParseLocationRange range;
  string serialized_value;
  string full_type_name;
  string prefix;
  string field_name;
  string prefix_and_full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [2];
  Reflection *local_1a8;
  undefined1 local_1a0 [48];
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150;
  string local_130;
  string local_110;
  Tokenizer *local_f0;
  ParserImpl *local_e8;
  Descriptor *local_e0;
  FieldDescriptor *local_d8;
  FieldDescriptor *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_04;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  local_1a8 = extraout_RDX;
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  pDVar10 = (Descriptor *)CONCAT44(extraout_var,iVar6);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_c0 = (ulong)(uint)(this->tokenizer_).current_.line;
  local_b8 = (ulong)(uint)(this->tokenizer_).current_.column;
  bVar4 = internal::GetAnyFieldDescriptors(message,&local_d0,&local_d8);
  if (bVar4) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[","");
    bVar4 = TryConsume(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    bVar4 = false;
  }
  this_01 = &this->tokenizer_;
  if (bVar4 != false) {
    local_170._8_8_ = 0;
    local_160._M_allocated_capacity = local_160._M_allocated_capacity & 0xffffffffffffff00;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_170._0_8_ = (FieldDescriptor *)(local_170 + 0x10);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    bVar4 = ConsumeAnyTypeUrl(this,(string *)local_170,&local_150);
    if (bVar4) {
      local_1e0._0_8_ = local_150._M_dataplus._M_p;
      local_1e0._8_8_ = local_150._M_string_length;
      local_1a0._0_8_ = local_170._0_8_;
      local_1a0._8_8_ = local_170._8_8_;
      StrCat_abi_cxx11_(&local_110,(protobuf *)local_1e0,(AlphaNum *)local_1a0,in_RCX);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"]","");
      bVar4 = ConsumeBeforeWhitespace(this,(string *)local_1e0);
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (bVar4) {
        if ((this_01->current_).type == TYPE_WHITESPACE) {
          io::Tokenizer::Next(this_01);
        }
        local_1e0._0_8_ = local_1e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,":","");
        TryConsumeBeforeWhitespace(this,(string *)local_1e0);
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_);
        }
        if ((this_01->current_).type == TYPE_WHITESPACE) {
          io::Tokenizer::Next(this_01);
        }
        local_1e0._0_8_ = local_1e0 + 0x10;
        local_1e0._8_8_ = (char *)0x0;
        local_1d0[0]._M_allocated_capacity = local_1d0[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          pDVar10 = anon_unknown_19::DefaultFinderFindAnyType
                              (message,&local_150,(string *)local_170);
        }
        else {
          iVar6 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&local_150,local_170);
          pDVar10 = (Descriptor *)CONCAT44(extraout_var_00,iVar6);
        }
        if (pDVar10 == (Descriptor *)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"Could not find type \"",&local_110);
          plVar11 = (long *)std::__cxx11::string::append(local_b0);
          pFVar15 = (FieldDescriptor *)(plVar11 + 2);
          if ((FieldDescriptor *)*plVar11 == pFVar15) {
            local_1a0._16_8_ = *(undefined8 *)pFVar15;
            local_1a0._24_8_ = plVar11[3];
            local_1a0._0_8_ = (FieldDescriptor *)(local_1a0 + 0x10);
          }
          else {
            local_1a0._16_8_ = *(undefined8 *)pFVar15;
            local_1a0._0_8_ = (FieldDescriptor *)*plVar11;
          }
          local_1a0._8_8_ = plVar11[1];
          *plVar11 = (long)pFVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_1a0);
          if ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10)) {
            operator_delete((void *)local_1a0._0_8_);
          }
          if ((FieldDescriptor *)local_b0._0_8_ != (FieldDescriptor *)(local_b0 + 0x10)) {
LAB_003bc316:
            operator_delete((void *)local_b0._0_8_);
          }
LAB_003bc31b:
          bVar4 = false;
        }
        else {
          bVar4 = ConsumeAnyValue(this,pDVar10,(string *)local_1e0);
          if (!bVar4) goto LAB_003bc31b;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             ((((~(byte)local_d0[1] & 0x60) != 0 &&
               (bVar4 = Reflection::HasField(local_1a8,message,local_d0), bVar4)) ||
              (((~(byte)local_d8[1] & 0x60) != 0 &&
               (bVar4 = Reflection::HasField(local_1a8,message,local_d8), bVar4)))))) {
            local_1a0._0_8_ = (FieldDescriptor *)(local_1a0 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a0,"Non-repeated Any specified multiple times.","");
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_1a0);
            local_b0._0_8_ = local_1a0._0_8_;
            if ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10))
            goto LAB_003bc316;
            goto LAB_003bc31b;
          }
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_110._M_dataplus._M_p,
                     local_110._M_dataplus._M_p + local_110._M_string_length);
          Reflection::SetString(local_1a8,message,local_d0,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_1e0._0_8_,(char *)(local_1e0._8_8_ + local_1e0._0_8_)
                    );
          Reflection::SetString(local_1a8,message,local_d8,&local_90);
          bVar4 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_);
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_170._0_8_ != (FieldDescriptor *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_);
    }
    goto LAB_003bd35b;
  }
  pcVar21 = (code *)(local_1e0 + 0x10);
  local_1e0._0_8_ = pcVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"[","");
  bVar4 = TryConsume(this,(string *)local_1e0);
  if ((code *)local_1e0._0_8_ != pcVar21) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if (bVar4) {
    bVar4 = ConsumeFullTypeName(this,&local_130);
    if (bVar4) {
      local_1e0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"]","");
      bVar4 = ConsumeBeforeWhitespace(this,(string *)local_1e0);
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (bVar4) {
        (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1e0);
        if ((this_01->current_).type == TYPE_WHITESPACE) {
          io::Tokenizer::Next(this_01);
        }
        if ((code *)local_1e0._0_8_ != pcVar21) {
          operator_delete((void *)local_1e0._0_8_);
        }
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])();
          pFVar15 = DescriptorPool::FindExtensionByPrintableName
                              (*(DescriptorPool **)
                                (*(long *)((Descriptor *)CONCAT44(extraout_var_03,iVar6) + 0x10) +
                                0x10),(Descriptor *)CONCAT44(extraout_var_03,iVar6),&local_130);
        }
        else {
          iVar6 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,&local_130);
          pFVar15 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar6);
        }
        if (pFVar15 == (FieldDescriptor *)0x0) {
          if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
            std::operator+(&local_150,"Ignoring extension \"",&local_130);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
            pFVar15 = (FieldDescriptor *)(puVar12 + 2);
            if ((FieldDescriptor *)*puVar12 == pFVar15) {
              local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
              local_160._8_8_ = puVar12[3];
              local_170._0_8_ = (FieldDescriptor *)(local_170 + 0x10);
            }
            else {
              local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
              local_170._0_8_ = (FieldDescriptor *)*puVar12;
            }
            local_170._8_8_ = puVar12[1];
            *puVar12 = pFVar15;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)(pDVar10 + 8) + 0x20));
            plVar11 = (long *)std::__cxx11::string::append(local_1a0);
            pcVar19 = (code *)(plVar11 + 2);
            if ((code *)*plVar11 == pcVar19) {
              local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
              local_1d0[0]._8_8_ = plVar11[3];
              local_1e0._0_8_ = pcVar21;
            }
            else {
              local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
              local_1e0._0_8_ = (code *)*plVar11;
            }
            local_1e0._8_8_ = plVar11[1];
            *plVar11 = (long)pcVar19;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                          (string *)local_1e0);
            if ((code *)local_1e0._0_8_ != pcVar21) {
              operator_delete((void *)local_1e0._0_8_);
            }
            if ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10)) {
              operator_delete((void *)local_1a0._0_8_);
            }
            if ((FieldDescriptor *)local_170._0_8_ != (FieldDescriptor *)(local_170 + 0x10)) {
              operator_delete((void *)local_170._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
            pFVar15 = (FieldDescriptor *)0x0;
            goto LAB_003bc63b;
          }
          std::operator+(&local_150,"Extension \"",&local_130);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
          local_170._0_8_ = local_170 + 0x10;
          pFVar15 = (FieldDescriptor *)(puVar12 + 2);
          if ((FieldDescriptor *)*puVar12 == pFVar15) {
            local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
            local_160._8_8_ = puVar12[3];
          }
          else {
            local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
            local_170._0_8_ = (FieldDescriptor *)*puVar12;
          }
          local_170._8_8_ = puVar12[1];
          *puVar12 = pFVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(pDVar10 + 8) + 0x20));
          puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a0);
          pcVar19 = (code *)(puVar12 + 2);
          if ((code *)*puVar12 == pcVar19) {
            local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
            local_1d0[0]._8_8_ = puVar12[3];
            local_1e0._0_8_ = pcVar21;
          }
          else {
            local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
            local_1e0._0_8_ = (code *)*puVar12;
          }
          local_1e0._8_8_ = puVar12[1];
          *puVar12 = pcVar19;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_1e0);
          goto LAB_003bccf5;
        }
LAB_003bc63b:
        bVar4 = false;
        goto LAB_003bc8f2;
      }
    }
    goto LAB_003bd358;
  }
  bVar4 = ConsumeIdentifierBeforeWhitespace(this,&local_130);
  if (!bVar4) goto LAB_003bd358;
  (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1e0);
  if ((this_01->current_).type == TYPE_WHITESPACE) {
    io::Tokenizer::Next(this_01);
  }
  if ((code *)local_1e0._0_8_ != pcVar21) {
    operator_delete((void *)local_1e0._0_8_);
  }
  local_e0 = pDVar10;
  if ((this->allow_field_number_ == true) &&
     (bVar4 = safe_strto32(&local_130,(int32 *)&local_110), bVar4)) {
    pEVar8 = Descriptor::FindExtensionRangeContainingNumber(pDVar10,(int)local_110._M_dataplus._M_p)
    ;
    if (pEVar8 == (ExtensionRange *)0x0) {
      pRVar14 = Descriptor::FindReservedRangeContainingNumber
                          (pDVar10,(int)local_110._M_dataplus._M_p);
      if (pRVar14 != (ReservedRange *)0x0) {
        bVar4 = true;
        goto LAB_003bc539;
      }
      pFVar15 = Descriptor::FindFieldByNumber(pDVar10,(int)local_110._M_dataplus._M_p);
    }
    else {
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        pFVar15 = DescriptorPool::FindExtensionByNumber
                            (*(DescriptorPool **)(*(long *)(pDVar10 + 0x10) + 0x10),pDVar10,
                             (int)local_110._M_dataplus._M_p);
      }
      else {
        iVar6 = (*pFVar1->_vptr_Finder[3])(pFVar1,pDVar10);
        pFVar15 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar6);
      }
    }
LAB_003bc6b9:
    bVar4 = false;
  }
  else {
    pFVar15 = Descriptor::FindFieldByName(pDVar10,&local_130);
    if (pFVar15 == (FieldDescriptor *)0x0) {
      local_1e0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e0,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      if ((char *)local_1e0._8_8_ != (char *)0x0) {
        pcVar18 = (char *)0x0;
        do {
          if ((byte)((char)*(code *)(local_1e0._0_8_ + (long)pcVar18) + 0xbfU) < 0x1a) {
            *(byte *)(local_1e0._0_8_ + (long)pcVar18) =
                 (byte)*(code *)(local_1e0._0_8_ + (long)pcVar18) | 0x20;
          }
          pcVar18 = pcVar18 + 1;
        } while ((char *)local_1e0._8_8_ != pcVar18);
      }
      pFVar9 = Descriptor::FindFieldByName(pDVar10,(ConstStringParam)local_1e0);
      if (pFVar9 == (FieldDescriptor *)0x0) {
        pFVar15 = (FieldDescriptor *)0x0;
      }
      else {
        if (*(once_flag **)(pFVar9 + 0x18) != (once_flag *)0x0) {
          local_1a0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_170._0_8_ = pFVar9;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar9 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1a0,
                     (FieldDescriptor **)local_170);
        }
        pFVar15 = (FieldDescriptor *)0x0;
        if (pFVar9[2] == (FieldDescriptor)0xa) {
          pFVar15 = pFVar9;
        }
      }
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
    }
    if (pFVar15 == (FieldDescriptor *)0x0) {
LAB_003bc3ec:
      pFVar15 = (FieldDescriptor *)0x0;
    }
    else {
      if (*(once_flag **)(pFVar15 + 0x18) != (once_flag *)0x0) {
        local_1e0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_1a0._0_8_ = pFVar15;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar15 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1e0,
                   (FieldDescriptor **)local_1a0);
      }
      if (pFVar15[2] == (FieldDescriptor)0xa) {
        pDVar13 = FieldDescriptor::message_type(pFVar15);
        sVar3 = (*(undefined8 **)(pDVar13 + 8))[1];
        if (sVar3 != local_130._M_string_length) goto LAB_003bc3ec;
        if (sVar3 != 0) {
          iVar6 = bcmp((void *)**(undefined8 **)(pDVar13 + 8),local_130._M_dataplus._M_p,sVar3);
          if (iVar6 != 0) {
            pFVar15 = (FieldDescriptor *)0x0;
          }
        }
      }
    }
    if (pFVar15 == (FieldDescriptor *)0x0) {
      if (this->allow_case_insensitive_field_ == true) {
        local_1e0._0_8_ = pcVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e0,local_130._M_dataplus._M_p,
                   local_130._M_dataplus._M_p + local_130._M_string_length);
        if ((char *)local_1e0._8_8_ != (char *)0x0) {
          pcVar18 = (char *)0x0;
          do {
            if ((byte)((char)*(code *)(local_1e0._0_8_ + (long)pcVar18) + 0xbfU) < 0x1a) {
              *(byte *)(local_1e0._0_8_ + (long)pcVar18) =
                   (byte)*(code *)(local_1e0._0_8_ + (long)pcVar18) | 0x20;
            }
            pcVar18 = pcVar18 + 1;
          } while ((char *)local_1e0._8_8_ != pcVar18);
        }
        pFVar15 = Descriptor::FindFieldByLowercaseName(pDVar10,(ConstStringParam)local_1e0);
        if ((code *)local_1e0._0_8_ != pcVar21) {
          operator_delete((void *)local_1e0._0_8_);
        }
      }
      else {
        pFVar15 = (FieldDescriptor *)0x0;
      }
    }
    __n = local_130._M_string_length;
    if (pFVar15 != (FieldDescriptor *)0x0) goto LAB_003bc6b9;
    uVar23 = (ulong)*(int *)(pDVar10 + 0x84);
    bVar4 = 0 < (long)uVar23;
    if (0 < (long)uVar23) {
      lVar2 = *(long *)(pDVar10 + 0x60);
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      bVar4 = true;
      uVar22 = 1;
      local_f0 = this_01;
      local_e8 = this;
      do {
        puVar12 = *(undefined8 **)(lVar2 + -8 + uVar22 * 8);
        if ((__n == puVar12[1]) &&
           ((this = local_e8, this_01 = local_f0, __n == 0 ||
            (iVar6 = bcmp(local_c8,(void *)*puVar12,__n), this = local_e8, this_01 = local_f0,
            iVar6 == 0)))) break;
        bVar4 = uVar22 < uVar23;
        bVar5 = uVar22 != uVar23;
        this = local_e8;
        this_01 = local_f0;
        uVar22 = uVar22 + 1;
      } while (bVar5);
    }
LAB_003bc539:
    pFVar15 = (FieldDescriptor *)0x0;
  }
  pcVar21 = (code *)(local_1e0 + 0x10);
  if (pFVar15 == (FieldDescriptor *)0x0 && !bVar4) {
    if (this->allow_unknown_field_ != false) {
      std::operator+(&local_150,"Message type \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(local_e0 + 8) + 0x20));
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
      pFVar9 = (FieldDescriptor *)(puVar12 + 2);
      if ((FieldDescriptor *)*puVar12 == pFVar9) {
        local_160._M_allocated_capacity = *(undefined8 *)pFVar9;
        local_160._8_8_ = puVar12[3];
        local_170._0_8_ = (FieldDescriptor *)(local_170 + 0x10);
      }
      else {
        local_160._M_allocated_capacity = *(undefined8 *)pFVar9;
        local_170._0_8_ = (FieldDescriptor *)*puVar12;
      }
      local_170._8_8_ = puVar12[1];
      *puVar12 = pFVar9;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     &local_130);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a0);
      pcVar19 = (code *)(puVar12 + 2);
      if ((code *)*puVar12 == pcVar19) {
        local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
        local_1d0[0]._8_8_ = puVar12[3];
        local_1e0._0_8_ = pcVar21;
      }
      else {
        local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
        local_1e0._0_8_ = (code *)*puVar12;
      }
      local_1e0._8_8_ = puVar12[1];
      *puVar12 = pcVar19;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1e0);
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10)) {
        operator_delete((void *)local_1a0._0_8_);
      }
      if ((FieldDescriptor *)local_170._0_8_ != (FieldDescriptor *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      goto LAB_003bc8f2;
    }
    std::operator+(&local_150,"Message type \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(local_e0 + 8) + 0x20));
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
    local_170._0_8_ = local_170 + 0x10;
    pFVar15 = (FieldDescriptor *)(puVar12 + 2);
    if ((FieldDescriptor *)*puVar12 == pFVar15) {
      local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
      local_160._8_8_ = puVar12[3];
    }
    else {
      local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
      local_170._0_8_ = (FieldDescriptor *)*puVar12;
    }
    local_170._8_8_ = puVar12[1];
    *puVar12 = pFVar15;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   &local_130);
    puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a0);
    pcVar19 = (code *)(puVar12 + 2);
    if ((code *)*puVar12 == pcVar19) {
      local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
      local_1d0[0]._8_8_ = puVar12[3];
      local_1e0._0_8_ = pcVar21;
    }
    else {
      local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
      local_1e0._0_8_ = (code *)*puVar12;
    }
    local_1e0._8_8_ = puVar12[1];
    *puVar12 = pcVar19;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                (string *)local_1e0);
LAB_003bccf5:
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_);
    }
    if ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10)) {
      operator_delete((void *)local_1a0._0_8_);
    }
    if ((FieldDescriptor *)local_170._0_8_ != (FieldDescriptor *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_);
    }
    paVar16 = &local_150.field_2;
    goto LAB_003bcf8a;
  }
LAB_003bc8f2:
  pcVar21 = (code *)(local_1e0 + 0x10);
  if (pFVar15 == (FieldDescriptor *)0x0) {
    if (((this->allow_unknown_extension_ | this->allow_unknown_field_) & 1U) == 0 && !bVar4) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_1e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                 ,0x221);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_1e0,
                         "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                        );
      internal::LogFinisher::operator=((LogFinisher *)local_1a0,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_1e0);
    }
    local_1e0._0_8_ = pcVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,":","");
    bVar4 = TryConsumeBeforeWhitespace(this,(string *)local_1e0);
    if ((code *)local_1e0._0_8_ != pcVar21) {
      operator_delete((void *)local_1e0._0_8_);
    }
    if (bVar4) {
      (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1e0);
      if ((this_01->current_).type == TYPE_WHITESPACE) {
        io::Tokenizer::Next(this_01);
      }
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      local_1e0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"{","");
      pcVar18 = (char *)(this->tokenizer_).current_.text._M_string_length;
      if (pcVar18 == (char *)local_1e0._8_8_) {
        if (pcVar18 == (char *)0x0) {
          bVar4 = true;
        }
        else {
          iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_1e0._0_8_,
                       (size_t)pcVar18);
          bVar4 = iVar6 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4) {
LAB_003bcd3b:
        bVar5 = false;
      }
      else {
        local_1a0._0_8_ = local_1a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"<","");
        sVar3 = (this->tokenizer_).current_.text._M_string_length;
        bVar5 = true;
        if (sVar3 == local_1a0._8_8_) {
          if (sVar3 == 0) goto LAB_003bcd3b;
          iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_1a0._0_8_,
                       sVar3);
          bVar5 = iVar6 != 0;
        }
      }
      if ((!bVar4) && ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10)))
      {
        operator_delete((void *)local_1a0._0_8_);
      }
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (bVar5) {
        bVar4 = SkipFieldValue(this);
        goto LAB_003bd35b;
      }
    }
    bVar4 = SkipFieldMessage(this);
    goto LAB_003bd35b;
  }
  if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
    if (((~(byte)pFVar15[1] & 0x60) == 0) ||
       (bVar4 = Reflection::HasField(local_1a8,message,pFVar15), !bVar4)) {
      oneof_descriptor = *(OneofDescriptor **)(pFVar15 + 0x28);
      if ((oneof_descriptor == (OneofDescriptor *)0x0 || ((byte)pFVar15[1] & 0x10) == 0) ||
         (bVar4 = Reflection::HasOneof(local_1a8,message,oneof_descriptor), !bVar4))
      goto LAB_003bcb3b;
      pFVar15 = Reflection::GetOneofFieldDescriptor(local_1a8,message,oneof_descriptor);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "Field \"",&local_130);
      plVar11 = (long *)std::__cxx11::string::append(local_b0);
      psVar17 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_110.field_2._M_allocated_capacity = *psVar17;
        local_110.field_2._8_8_ = plVar11[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar17;
        local_110._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_110._M_string_length = plVar11[1];
      *plVar11 = (long)psVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::operator+(&local_150,&local_110,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pFVar15 + 8));
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
      pFVar15 = (FieldDescriptor *)(puVar12 + 2);
      if ((FieldDescriptor *)*puVar12 == pFVar15) {
        local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
        local_160._8_8_ = puVar12[3];
        local_170._0_8_ = (FieldDescriptor *)(local_170 + 0x10);
      }
      else {
        local_160._M_allocated_capacity = *(undefined8 *)pFVar15;
        local_170._0_8_ = (FieldDescriptor *)*puVar12;
      }
      local_170._8_8_ = puVar12[1];
      *puVar12 = pFVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (oneof_descriptor + 8));
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a0);
      pcVar19 = (code *)(puVar12 + 2);
      if ((code *)*puVar12 == pcVar19) {
        local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
        local_1d0[0]._8_8_ = puVar12[3];
        local_1e0._0_8_ = pcVar21;
      }
      else {
        local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
        local_1e0._0_8_ = (code *)*puVar12;
      }
      local_1e0._8_8_ = puVar12[1];
      *puVar12 = pcVar19;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  (string *)local_1e0);
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if ((FieldDescriptor *)local_1a0._0_8_ != (FieldDescriptor *)(local_1a0 + 0x10)) {
        operator_delete((void *)local_1a0._0_8_);
      }
      if ((FieldDescriptor *)local_170._0_8_ != (FieldDescriptor *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_b0 + 0x10);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "Non-repeated field \"",&local_130);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a0);
      pcVar19 = (code *)(puVar12 + 2);
      if ((code *)*puVar12 == pcVar19) {
        local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
        local_1d0[0]._8_8_ = puVar12[3];
        local_1e0._0_8_ = pcVar21;
      }
      else {
        local_1d0[0]._0_8_ = *(undefined8 *)pcVar19;
        local_1e0._0_8_ = (code *)*puVar12;
      }
      local_1e0._8_8_ = puVar12[1];
      *puVar12 = pcVar19;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  (string *)local_1e0);
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1a0 + 0x10);
    }
LAB_003bcf8a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar16->_M_allocated_capacity)[-2] != paVar16) {
      operator_delete((undefined1 *)(&paVar16->_M_allocated_capacity)[-2]);
    }
LAB_003bd358:
    bVar4 = false;
  }
  else {
LAB_003bcb3b:
    if (*(once_flag **)(pFVar15 + 0x18) != (once_flag *)0x0) {
      local_1e0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_1a0._0_8_ = pFVar15;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar15 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1e0,
                 (FieldDescriptor **)local_1a0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar15[2] * 4) == 10) {
      local_1e0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,":","");
      bVar4 = TryConsumeBeforeWhitespace(this,(string *)local_1e0);
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1e0);
      if ((this_01->current_).type == TYPE_WHITESPACE) {
        io::Tokenizer::Next(this_01);
      }
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      iVar6 = 0;
      if (((bVar4) && (iVar6 = 0, *(char *)(*(long *)(pFVar15 + 0x38) + 0x4f) == '\x01')) &&
         ((this_01->current_).type == TYPE_STRING)) {
        local_1e0._8_8_ = (char *)0x0;
        local_1d0[0]._M_allocated_capacity = local_1d0[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        local_1e0._0_8_ = pcVar21;
        bVar4 = ConsumeString(this,(string *)local_1e0);
        iVar6 = 1;
        if (bVar4) {
          pFVar1 = this->finder_;
          if (pFVar1 == (Finder *)0x0) {
            factory = (MessageFactory *)0x0;
          }
          else {
            iVar6 = (*pFVar1->_vptr_Finder[5])(pFVar1,pFVar15);
            factory = (MessageFactory *)CONCAT44(extraout_var_04,iVar6);
          }
          this_00 = &Reflection::MutableMessage(local_1a8,message,pFVar15,factory)->
                     super_MessageLite;
          iVar6 = 2;
          MessageLite::ParseFromString(this_00,(ConstStringParam)local_1e0);
        }
        if ((code *)local_1e0._0_8_ != pcVar21) {
          operator_delete((void *)local_1e0._0_8_);
        }
      }
      if (iVar6 == 0) goto LAB_003bd08b;
      if (iVar6 != 2) goto LAB_003bd358;
    }
    else {
      local_1e0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,":","");
      bVar4 = ConsumeBeforeWhitespace(this,(string *)local_1e0);
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (!bVar4) goto LAB_003bd358;
      (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1e0);
      if ((this_01->current_).type == TYPE_WHITESPACE) {
        io::Tokenizer::Next(this_01);
      }
      if ((code *)local_1e0._0_8_ != pcVar21) {
        operator_delete((void *)local_1e0._0_8_);
      }
LAB_003bd08b:
      if (((byte)pFVar15[1] & 0x60) == 0x60) {
        local_1e0._0_8_ = pcVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"[","");
        bVar4 = TryConsume(this,(string *)local_1e0);
        if ((code *)local_1e0._0_8_ != pcVar21) {
          operator_delete((void *)local_1e0._0_8_);
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4 == false) {
        CVar7 = FieldDescriptor::cpp_type(pFVar15);
        if (CVar7 == CPPTYPE_MESSAGE) {
          bVar4 = ConsumeFieldMessage(this,message,local_1a8,pFVar15);
        }
        else {
          bVar4 = ConsumeFieldValue(this,message,local_1a8,pFVar15);
        }
        if (bVar4 == false) goto LAB_003bd358;
      }
      else {
        pFVar9 = (FieldDescriptor *)(local_1a0 + 0x10);
        local_1a0._0_8_ = pFVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"]","");
        bVar4 = TryConsume(this,(string *)local_1a0);
        if ((FieldDescriptor *)local_1a0._0_8_ != pFVar9) {
          operator_delete((void *)local_1a0._0_8_);
        }
        if (!bVar4) {
          do {
            if (*(once_flag **)(pFVar15 + 0x18) != (once_flag *)0x0) {
              local_1a0._0_8_ = FieldDescriptor::TypeOnceInit;
              local_170._0_8_ = pFVar15;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(pFVar15 + 0x18),
                         (_func_void_FieldDescriptor_ptr **)local_1a0,(FieldDescriptor **)local_170)
              ;
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar15[2] * 4) == 10) {
              bVar4 = ConsumeFieldMessage(this,message,local_1a8,pFVar15);
            }
            else {
              bVar4 = ConsumeFieldValue(this,message,local_1a8,pFVar15);
            }
            if (bVar4 == false) goto LAB_003bd358;
            local_1a0._0_8_ = pFVar9;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"]","");
            bVar4 = TryConsume(this,(string *)local_1a0);
            if ((FieldDescriptor *)local_1a0._0_8_ != pFVar9) {
              operator_delete((void *)local_1a0._0_8_);
            }
            if (bVar4) goto LAB_003bd26d;
            local_1a0._0_8_ = pFVar9;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,",","");
            bVar5 = Consume(this,(string *)local_1a0);
            if ((FieldDescriptor *)local_1a0._0_8_ != pFVar9) {
              operator_delete((void *)local_1a0._0_8_);
            }
            bVar4 = false;
          } while (bVar5);
          goto LAB_003bd35b;
        }
      }
    }
LAB_003bd26d:
    pFVar9 = (FieldDescriptor *)(local_1a0 + 0x10);
    local_1a0._0_8_ = pFVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,";","");
    bVar4 = TryConsume(this,(string *)local_1a0);
    if (!bVar4) {
      local_170._0_8_ = (FieldDescriptor *)(local_170 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,",","");
      TryConsume(this,(string *)local_170);
      if ((!bVar4) && ((FieldDescriptor *)local_170._0_8_ != (FieldDescriptor *)(local_170 + 0x10)))
      {
        operator_delete((void *)local_170._0_8_);
      }
    }
    if ((FieldDescriptor *)local_1a0._0_8_ != pFVar9) {
      operator_delete((void *)local_1a0._0_8_);
    }
    if (*(char *)(*(long *)(pFVar15 + 0x38) + 0x4e) == '\x01') {
      std::operator+(&local_150,"text format contains deprecated field \"",&local_130);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
      pFVar20 = (FieldDescriptor *)(puVar12 + 2);
      if ((FieldDescriptor *)*puVar12 == pFVar20) {
        local_1a0._16_8_ = *(undefined8 *)pFVar20;
        local_1a0._24_8_ = puVar12[3];
        local_1a0._0_8_ = pFVar9;
      }
      else {
        local_1a0._16_8_ = *(undefined8 *)pFVar20;
        local_1a0._0_8_ = (FieldDescriptor *)*puVar12;
      }
      local_1a0._8_8_ = puVar12[1];
      *puVar12 = pFVar20;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1a0);
      if ((FieldDescriptor *)local_1a0._0_8_ != pFVar9) {
        operator_delete((void *)local_1a0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
    }
    bVar4 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      range.start = (ParseLocation)((local_b8 << 0x20) + local_c0);
      range.end.column = (this->tokenizer_).previous_.end_column;
      range.end.line = (this->tokenizer_).previous_.line;
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar15,range);
    }
  }
LAB_003bd35b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      // ':' is optional between message labels and values.
      TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix_and_full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            prefix_and_full_type_name);
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(message->GetTypeName(), "Extension");

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");

      int32_t field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace(message->GetTypeName(), "Unknown/Reserved");
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }